

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall Image::EmplaceData(Image *this,string *filename)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  size_type __new_size;
  pointer pRVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  RgbaInputFile in;
  
  pcVar2 = (filename->_M_dataplus)._M_p;
  iVar3 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile(&in,pcVar2,iVar3);
  piVar4 = (int *)Imf_2_5::RgbaInputFile::dataWindow();
  iVar3 = *piVar4;
  iVar1 = piVar4[1];
  uVar8 = ((long)piVar4[2] - (long)iVar3) + 1;
  uVar6 = (piVar4[3] - iVar1) + 1;
  iVar7 = (int)uVar8;
  printf("Loaded EXR \"%s\", image has %dx%d \n",pcVar2,uVar8 & 0xffffffff,(ulong)uVar6);
  __new_size = (size_type)(int)(uVar6 * iVar7);
  pRVar5 = (this->m_Data).super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(this->m_Data).super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl
            .super__Vector_impl_data._M_finish - (long)pRVar5 >> 3 != __new_size) {
    printf("Allocating buffer for %ld pixels\n",__new_size);
    std::vector<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>::resize(&this->m_Data,__new_size);
    pRVar5 = (this->m_Data).super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  Imf_2_5::RgbaInputFile::setFrameBuffer
            ((Rgba *)&in,(ulong)(pRVar5 + (-(long)iVar3 - (long)(iVar7 * iVar1))),1);
  Imf_2_5::RgbaInputFile::readPixels((int)&in,iVar1);
  (this->m_Size).x = iVar7;
  (this->m_Size).y = uVar6;
  Imf_2_5::RgbaInputFile::~RgbaInputFile(&in);
  return;
}

Assistant:

void Image::EmplaceData(const std::string &filename) {

    auto fn = filename.c_str();

    try {

        Imf::RgbaInputFile in(fn);

        Imath::Box2i win = in.dataWindow();

        Imath::V2i dim(win.max.x - win.min.x + 1, win.max.y - win.min.y + 1);

        parallel_printf("Loaded EXR \"%s\", image has %dx%d \n", fn, dim.x,
                        dim.y);

        size_t datalen = dim.x * dim.y;

        {
        if (m_Data.size() != datalen) {
            parallel_printf("Allocating buffer for %ld pixels\n", datalen);
            m_Data.resize(datalen);
        }
        }

        int dx = win.min.x;
        int dy = win.min.y;

        in.setFrameBuffer(m_Data.data() - dx - dy * dim.x, 1, dim.x);
        in.readPixels(win.min.y, win.max.y);
        m_Size = dim;

    } catch (Iex::BaseExc &e) {
        parallel_printf("Error loading EXR from \"%s\" err=%s \n", fn,
                        e.what());
        throw;
    }
}